

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdeadlinetimer.h
# Opt level: O0

void __thiscall
QDeadlineTimer::QDeadlineTimer<int,std::ratio<1l,1000l>>
          (QDeadlineTimer *this,duration<int,_std::ratio<1L,_1000L>_> remaining,TimerType type_)

{
  long lVar1;
  TimerType in_EDX;
  QDeadlineTimer *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->t1 = 0;
  in_RDI->t2 = 0;
  in_RDI->type = 1;
  setRemainingTime<int,std::ratio<1l,1000l>>
            (in_RDI,(duration<int,_std::ratio<1L,_1000L>_>)type_,in_EDX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDeadlineTimer(std::chrono::duration<Rep, Period> remaining, Qt::TimerType type_ = Qt::CoarseTimer)
        : t2(0)
    { setRemainingTime(remaining, type_); }